

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O2

void __thiscall
Volume::calculateVisualSpace
          (Volume *this,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *_obstcs,Vector2d *obs,Mat *src)

{
  pointer pvVar1;
  pointer pPVar2;
  Object *pOVar3;
  pointer pEVar4;
  _Elt_pointer pMVar5;
  double dVar6;
  double dVar7;
  pointer pvVar8;
  size_type sVar9;
  _Elt_pointer pMVar10;
  array<cv::Point_<int>,_11UL> *paVar11;
  array<cv::Point_<int>,_9UL> *paVar12;
  Object *obj_00;
  pointer pts;
  Object *this_00;
  pointer __args;
  Edge *eg;
  pointer this_01;
  int iVar13;
  Obstacle *obstacle;
  pointer pvVar14;
  long lVar15;
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  obstcs;
  Object obj;
  Vector2d local_48;
  
  std::vector<Object,_std::allocator<Object>_>::clear
            ((vector<Object,_std::allocator<Object>_> *)(this + 0x20));
  obstcs.
  super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  obstcs.
  super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  obstcs.
  super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar1 = (_obstcs->
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar14 = (_obstcs->
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pvVar14 != pvVar1;
      pvVar14 = pvVar14 + 1) {
    std::
    vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
    ::emplace_back<>(&obstcs);
    pPVar2 = (pvVar14->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (__args = (pvVar14->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start; __args != pPVar2; __args = __args + 1) {
      std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
      emplace_back<int_const&,int_const&>
                ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                  *)(obstcs.
                     super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1),&__args->x,&__args->y);
    }
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::emplace_back<>(&obstcs);
  paVar11 = &north_wall;
  for (lVar15 = 0x58; lVar15 != 0; lVar15 = lVar15 + -8) {
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                *)(obstcs.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1),(int *)paVar11,
               &paVar11->_M_elems[0].y);
    paVar11 = (array<cv::Point_<int>,_11UL> *)((long)paVar11 + 8);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::emplace_back<>(&obstcs);
  paVar12 = &east_wall;
  for (lVar15 = 0x48; lVar15 != 0; lVar15 = lVar15 + -8) {
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                *)(obstcs.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1),(int *)paVar12,
               &paVar12->_M_elems[0].y);
    paVar12 = (array<cv::Point_<int>,_9UL> *)((long)paVar12 + 8);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::emplace_back<>(&obstcs);
  paVar11 = &south_wall;
  for (lVar15 = 0x58; lVar15 != 0; lVar15 = lVar15 + -8) {
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                *)(obstcs.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1),(int *)paVar11,
               &paVar11->_M_elems[0].y);
    paVar11 = (array<cv::Point_<int>,_11UL> *)((long)paVar11 + 8);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::emplace_back<>(&obstcs);
  paVar12 = &west_wall;
  for (lVar15 = 0x48;
      pvVar8 = obstcs.
               super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, lVar15 != 0; lVar15 = lVar15 + -8) {
    std::vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>::
    emplace_back<int_const&,int_const&>
              ((vector<Eigen::Matrix<double,2,1,0,2,1>,std::allocator<Eigen::Matrix<double,2,1,0,2,1>>>
                *)(obstcs.
                   super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1),(int *)paVar12,
               &paVar12->_M_elems[0].y);
    paVar12 = (array<cv::Point_<int>,_9UL> *)((long)paVar12 + 8);
  }
  iVar13 = 0;
  for (pts = obstcs.
             super__Vector_base<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; pts != pvVar8; pts = pts + 1) {
    obj.id = iVar13;
    obj.edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    obj.angle_range.first = 0.0;
    obj.edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    obj.edges.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    obj.angle_range.second = 0.0;
    obj.min_dist = 1000000000.0;
    Object::intialize(&obj,pts,obs);
    std::vector<Object,_std::allocator<Object>_>::push_back
              ((vector<Object,_std::allocator<Object>_> *)(this + 0x20),&obj);
    iVar13 = iVar13 + 1;
    std::vector<Edge,_std::allocator<Edge>_>::~vector(&obj.edges);
  }
  for (obj._0_8_ = 0;
      (ulong)obj._0_8_ < (ulong)((*(long *)(this + 0x28) - *(long *)(this + 0x20)) / 0x38);
      obj._0_8_ = obj._0_8_ + 1) {
    std::
    priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,Volume::ObjCompFunctor>
    ::emplace<unsigned_long&>
              ((priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,Volume::ObjCompFunctor>
                *)this,(unsigned_long *)&obj);
  }
  while (*(long **)this != *(long **)(this + 8)) {
    this_00 = (Object *)(**(long **)this * 0x38 + *(long *)(this + 0x20));
    std::
    priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
    ::pop((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Volume::ObjCompFunctor>
           *)this);
    Object::internalProjection(this_00,obs);
    pOVar3 = *(Object **)(this + 0x28);
    for (obj_00 = *(Object **)(this + 0x20); obj_00 != pOVar3; obj_00 = obj_00 + 1) {
      if ((obj_00->valid != false) && (this_00->id != obj_00->id)) {
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
        [0] = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[0];
        local_48.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array
        [1] = (obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
              array[1];
        Object::externalOcclusion(this_00,obj_00,&local_48);
        pEVar4 = (obj_00->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (this_01 = (obj_00->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                       super__Vector_impl_data._M_start; this_01 != pEVar4; this_01 = this_01 + 1) {
          if ((this_01->valid != false) &&
             (sVar9 = std::
                      deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ::size(&this_01->
                              super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ), sVar9 < 3)) {
            pMVar10 = (this_01->
                      super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ).
                      super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pMVar10 ==
                (this_01->
                super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ).
                super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              pMVar10 = (this_01->
                        super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ).
                        super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
            }
            pMVar5 = (this_01->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ).
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            dVar6 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data.array[0] -
                    pMVar10[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0];
            dVar7 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                    .m_data.array[1] -
                    pMVar10[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[1];
            if (SQRT(dVar7 * dVar7 + dVar6 * dVar6) < 1.0) {
              this_01->valid = false;
            }
          }
        }
      }
    }
    obj._4_4_ = (int)(obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                     m_data.array[1];
    obj.id = (int)(obs->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0];
    simplePreVisualize(this,src,(Point *)&obj);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>_>_>
  ::~vector(&obstcs);
  return;
}

Assistant:

void Volume::calculateVisualSpace(const std::vector<Obstacle>& _obstcs, Eigen::Vector2d obs, cv::Mat& src) {
    objs.clear();
    std::vector<std::vector<Eigen::Vector2d>> obstcs;
    for (const Obstacle& obstacle: _obstcs) {            // 构建objects
        obstcs.emplace_back();
        for (const cv::Point& pt: obstacle)
            obstcs.back().emplace_back(pt.x, pt.y);
    }
    // ================ add walls ================
    obstcs.emplace_back();
    for (const cv::Point& pt: north_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: east_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: south_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 
    obstcs.emplace_back();
    for (const cv::Point& pt: west_wall)
        obstcs.back().emplace_back(pt.x, pt.y); 

    int obj_cnt = 0;
    for (const std::vector<Eigen::Vector2d>& obstacle: obstcs) {            // 构建objects
        Object obj(obj_cnt);
        obj.intialize(obstacle, obs);
        objs.push_back(obj);
        obj_cnt++;
    }
    for (size_t i = 0; i < objs.size(); i++)            // 构建堆
        heap.emplace(i);
    while (heap.empty() == false) {
        size_t obj_id = heap.top();
        Object& obj = objs[obj_id];
        heap.pop();
        LOG_ERROR("Object %d, started to internal project.", obj_id);
        obj.internalProjection(obs);
        LOG_MARK("After interal proj, valids in object %d are:", obj_id);
        LOG_MARK("Object %d, started to external project.", obj_id);
        for (Object& projectee: objs) {
            // 不查看完全被遮挡的，不投影已经投影过的
            if (projectee.valid == false || obj.id == projectee.id) continue;
            LOG_GAY("External occ, object %lu", projectee.id);
            obj.externalOcclusion(projectee, obs);
            LOG_CHECK("Projectee (%d) processed, edges (valid):", projectee.id);
            for (Edge& eg: projectee.edges) {
                if (eg.valid == false || eg.size() > 2) continue;
                Eigen::Vector2d diff = eg.front().block<2, 1>(0, 0) - eg.back().block<2, 1>(0, 0);
                if (diff.norm() < 1.0) {
                    LOG_ERROR("Projectee %d has one singular edge, (%.4lf, %.4lf), (%.4lf, %.4lf)", projectee.id, eg.front().x(), eg.front().y(), eg.back().x(), eg.back().y());
                    eg.valid = false;
                }
            }
        }
        LOG_SHELL("After external proj, valids in object %d are:", obj_id);
        simplePreVisualize(src, cv::Point(obs.x(), obs.y()));
    }
}